

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

PCRE2_SPTR8 get_chr_property_list(PCRE2_SPTR8 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  byte bVar1;
  PCRE2_UCHAR8 PVar2;
  char cVar3;
  uint uVar4;
  uint32_t uVar5;
  byte *pbVar6;
  bool local_59;
  uint32_t *local_58;
  uint32_t *clist_src;
  uint32_t *clist_dest;
  byte *pbStack_40;
  uint32_t chr;
  PCRE2_SPTR8 end;
  PCRE2_UCHAR8 base;
  PCRE2_UCHAR8 c;
  uint32_t *list_local;
  uint8_t *fcc_local;
  byte *pbStack_18;
  BOOL utf_local;
  PCRE2_SPTR8 code_local;
  
  end._7_1_ = *code;
  *list = (uint)end._7_1_;
  list[1] = 0;
  pbStack_18 = code + 1;
  if ((0x20 < end._7_1_) && (end._7_1_ < 0x62)) {
    PVar2 = get_repeat_base(end._7_1_);
    cVar3 = end._7_1_ - (PVar2 + 0xdf);
    if ((cVar3 == '\'') || (((cVar3 == '(' || (cVar3 == ')')) || (cVar3 == '-')))) {
      pbStack_18 = code + 3;
    }
    local_59 = false;
    if (((cVar3 != '#') && (local_59 = false, cVar3 != '$')) && (local_59 = false, cVar3 != ')')) {
      local_59 = cVar3 != '+';
    }
    list[1] = (uint)local_59;
    if (PVar2 == '!') {
      *list = 0x1d;
    }
    else if (PVar2 == '.') {
      *list = 0x1e;
    }
    else if (PVar2 == ';') {
      *list = 0x1f;
    }
    else if (PVar2 == 'H') {
      *list = 0x20;
    }
    else if (PVar2 == 'U') {
      *list = (uint)*pbStack_18;
      pbStack_18 = pbStack_18 + 1;
    }
    end._7_1_ = (byte)*list;
  }
  switch(end._7_1_) {
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    code_local = pbStack_18;
    break;
  default:
    code_local = (PCRE2_SPTR8)0x0;
    break;
  case 0xf:
  case 0x10:
    if (*pbStack_18 == 9) {
      code_local = pbStack_18 + 2;
      local_58 = _pcre2_ucd_caseless_sets_8 + (int)(uint)pbStack_18[1];
      clist_src = list + 2;
      do {
        if (list + 8 <= clist_src) {
          list[2] = (uint)*code_local;
          list[3] = (uint)pbStack_18[3];
          return code_local;
        }
        *clist_src = *local_58;
        uVar5 = *local_58;
        local_58 = local_58 + 1;
        clist_src = clist_src + 1;
      } while (uVar5 != 0xffffffff);
      uVar5 = 0x1f;
      if (end._7_1_ == 0x10) {
        uVar5 = 0x1d;
      }
      *list = uVar5;
    }
    else {
      list[2] = (uint)*pbStack_18;
      list[3] = (uint)pbStack_18[1];
      code_local = pbStack_18 + 2;
    }
    break;
  case 0x1d:
  case 0x1f:
    pbVar6 = pbStack_18 + 1;
    bVar1 = *pbStack_18;
    clist_dest._4_4_ = (uint)bVar1;
    if ((utf != 0) && (0xbf < clist_dest._4_4_)) {
      if ((bVar1 & 0x20) == 0) {
        clist_dest._4_4_ = (clist_dest._4_4_ & 0x1f) << 6 | *pbVar6 & 0x3f;
        pbVar6 = pbStack_18 + 2;
      }
      else if ((bVar1 & 0x10) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 0xf) << 0xc | (*pbVar6 & 0x3f) << 6 | pbStack_18[2] & 0x3f;
        pbVar6 = pbStack_18 + 3;
      }
      else if ((bVar1 & 8) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 7) << 0x12 | (*pbVar6 & 0x3f) << 0xc | (pbStack_18[2] & 0x3f) << 6
             | pbStack_18[3] & 0x3f;
        pbVar6 = pbStack_18 + 4;
      }
      else if ((bVar1 & 4) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 3) << 0x18 | (*pbVar6 & 0x3f) << 0x12 |
             (pbStack_18[2] & 0x3f) << 0xc | (pbStack_18[3] & 0x3f) << 6 | pbStack_18[4] & 0x3f;
        pbVar6 = pbStack_18 + 5;
      }
      else {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 1) << 0x1e | (*pbVar6 & 0x3f) << 0x18 |
             (pbStack_18[2] & 0x3f) << 0x12 | (pbStack_18[3] & 0x3f) << 0xc |
             (pbStack_18[4] & 0x3f) << 6 | pbStack_18[5] & 0x3f;
        pbVar6 = pbStack_18 + 6;
      }
    }
    pbStack_18 = pbVar6;
    list[2] = clist_dest._4_4_;
    list[3] = 0xffffffff;
    code_local = pbStack_18;
    break;
  case 0x1e:
  case 0x20:
    uVar5 = 0x1f;
    if (end._7_1_ == 0x1e) {
      uVar5 = 0x1d;
    }
    *list = uVar5;
    pbVar6 = pbStack_18 + 1;
    bVar1 = *pbStack_18;
    clist_dest._4_4_ = (uint)bVar1;
    if ((utf != 0) && (0xbf < clist_dest._4_4_)) {
      if ((bVar1 & 0x20) == 0) {
        clist_dest._4_4_ = (clist_dest._4_4_ & 0x1f) << 6 | *pbVar6 & 0x3f;
        pbVar6 = pbStack_18 + 2;
      }
      else if ((bVar1 & 0x10) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 0xf) << 0xc | (*pbVar6 & 0x3f) << 6 | pbStack_18[2] & 0x3f;
        pbVar6 = pbStack_18 + 3;
      }
      else if ((bVar1 & 8) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 7) << 0x12 | (*pbVar6 & 0x3f) << 0xc | (pbStack_18[2] & 0x3f) << 6
             | pbStack_18[3] & 0x3f;
        pbVar6 = pbStack_18 + 4;
      }
      else if ((bVar1 & 4) == 0) {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 3) << 0x18 | (*pbVar6 & 0x3f) << 0x12 |
             (pbStack_18[2] & 0x3f) << 0xc | (pbStack_18[3] & 0x3f) << 6 | pbStack_18[4] & 0x3f;
        pbVar6 = pbStack_18 + 5;
      }
      else {
        clist_dest._4_4_ =
             (clist_dest._4_4_ & 1) << 0x1e | (*pbVar6 & 0x3f) << 0x18 |
             (pbStack_18[2] & 0x3f) << 0x12 | (pbStack_18[3] & 0x3f) << 0xc |
             (pbStack_18[4] & 0x3f) << 6 | pbStack_18[5] & 0x3f;
        pbVar6 = pbStack_18 + 6;
      }
    }
    pbStack_18 = pbVar6;
    list[2] = clist_dest._4_4_;
    if ((clist_dest._4_4_ < 0x80) || ((clist_dest._4_4_ < 0x100 && (utf == 0)))) {
      list[3] = (uint)fcc[clist_dest._4_4_];
    }
    else {
      list[3] = clist_dest._4_4_ +
                _pcre2_ucd_records_8
                [(int)(uint)_pcre2_ucd_stage2_8
                            [(int)((uint)""[(int)(clist_dest._4_4_ / 0x80)] * 0x80 +
                                  clist_dest._4_4_ % 0x80)]].other_case;
    }
    if (clist_dest._4_4_ == list[3]) {
      list[3] = 0xffffffff;
    }
    else {
      list[4] = 0xffffffff;
    }
    code_local = pbStack_18;
    break;
  case 0x6e:
  case 0x6f:
  case 0x70:
    if (end._7_1_ == 0x70) {
      pbStack_40 = pbStack_18 + (long)(int)(uint)CONCAT11(*pbStack_18,pbStack_18[1]) + -1;
    }
    else {
      pbStack_40 = pbStack_18 + 0x20;
    }
    uVar4 = (uint)*pbStack_40;
    if (uVar4 - 0x62 < 2) {
LAB_00137e49:
      list[1] = 1;
      pbStack_40 = pbStack_40 + 1;
    }
    else {
      if (1 < uVar4 - 100) {
        if (1 < uVar4 - 0x66) {
          if (uVar4 - 0x68 < 2) {
LAB_00137e70:
            list[1] = (uint)(CONCAT11(pbStack_40[1],pbStack_40[2]) == 0);
            pbStack_40 = pbStack_40 + 5;
            goto LAB_00137ea3;
          }
          if (uVar4 != 0x6a) {
            if (uVar4 == 0x6b) goto LAB_00137e62;
            if (uVar4 != 0x6c) {
              if (uVar4 == 0x6d) goto LAB_00137e70;
              goto LAB_00137ea3;
            }
          }
        }
        goto LAB_00137e49;
      }
LAB_00137e62:
      pbStack_40 = pbStack_40 + 1;
    }
LAB_00137ea3:
    list[2] = (int)pbStack_40 - (int)pbStack_18;
    code_local = pbStack_40;
  }
  return code_local;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}